

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

key_type * __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::get_key(key_type *__return_storage_ptr__,
         hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
         *this,database *db,address addr)

{
  uint128 *puVar1;
  database_reader *archive;
  database_reader local_40;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_30;
  database *db_local;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  address addr_local;
  
  local_30 = this;
  db_local = (database *)__return_storage_ptr__;
  this_local = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)db;
  serialize::archive::database_reader::database_reader(&local_40,(database *)this,(address)db);
  puVar1 = serialize::read<pstore::uint128,pstore::serialize::archive::database_reader>
                     ((uint128 *)&local_40,(serialize *)this,archive);
  return puVar1;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::get_key (database const & db,
                                                                    address const addr) const
            -> key_type {

            return serialize::read<KeyType> (serialize::archive::database_reader{db, addr});
        }